

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::DispatchComputeIndirect
          (DeviceContextGLImpl *this,DispatchComputeIndirectAttribs *Attribs)

{
  PFNGLDISPATCHCOMPUTEINDIRECTPROC p_Var1;
  byte bVar2;
  PipelineStateGLImpl *this_00;
  BufferGLImpl *this_01;
  Char *pCVar3;
  long lVar4;
  GLBufferObj local_8c;
  undefined1 local_80 [8];
  string msg_1;
  GLenum err_1;
  undefined1 local_50 [8];
  string msg;
  GLenum err;
  bool ResetVAO;
  BufferGLImpl *pBufferGL;
  Uint32 BindSRBMask;
  DispatchComputeIndirectAttribs *Attribs_local;
  DeviceContextGLImpl *this_local;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::DispatchComputeIndirect
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  this_00 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                      (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                        m_pPipelineState);
  PipelineStateGLImpl::CommitProgram(this_00,&this->m_ContextState);
  bVar2 = DeviceContextBase<Diligent::EngineGLImplTraits>::CommittedShaderResources::GetCommitMask
                    (&(this->m_BindInfo).super_CommittedShaderResources,false);
  if (bVar2 != 0) {
    BindProgramResources(this,(uint)bVar2);
  }
  DvpValidateCommittedShaderResources(this);
  this_01 = ClassPtrCast<Diligent::BufferGLImpl,Diligent::IBuffer>(Attribs->pAttribsBuffer);
  BufferGLImpl::BufferMemoryBarrier(this_01,MEMORY_BARRIER_INDIRECT_BUFFER,&this->m_ContextState);
  msg.field_2._M_local_buf[0xf] = '\0';
  GLContextState::BindBuffer(&this->m_ContextState,0x90ee,&this_01->m_GlBuffer,false);
  msg.field_2._8_4_ = glGetError();
  if (msg.field_2._8_4_ != 0) {
    LogError<false,char[54],char[17],unsigned_int>
              (false,"DispatchComputeIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x57b,(char (*) [54])"Failed to bind a buffer for dispatch indirect command",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
    FormatString<char[6]>((string *)local_50,(char (*) [6])0xe8e72e);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"DispatchComputeIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x57b);
    std::__cxx11::string::~string((string *)local_50);
  }
  p_Var1 = __glewDispatchComputeIndirect;
  lVar4 = StaticCast<long,unsigned_long>(&Attribs->DispatchArgsByteOffset);
  (*p_Var1)(lVar4);
  msg_1.field_2._8_4_ = glGetError();
  if (msg_1.field_2._8_4_ != 0) {
    LogError<false,char[35],char[17],unsigned_int>
              (false,"DispatchComputeIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x57e,(char (*) [35])"glDispatchComputeIndirect() failed",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 8));
    FormatString<char[6]>((string *)local_80,(char (*) [6])0xe8e72e);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"DispatchComputeIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x57e);
    std::__cxx11::string::~string((string *)local_80);
  }
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::Null();
  GLContextState::BindBuffer(&this->m_ContextState,0x90ee,&local_8c,false);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
            (&local_8c);
  PostDraw(this);
  return;
}

Assistant:

void DeviceContextGLImpl::DispatchComputeIndirect(const DispatchComputeIndirectAttribs& Attribs)
{
    TDeviceContextBase::DispatchComputeIndirect(Attribs, 0);

#if GL_ARB_compute_shader
    // The program might have changed since the last SetPipelineState call if a shader was
    // created after the call (ShaderResourcesGL needs to bind a program to load uniforms).
    m_pPipelineState->CommitProgram(m_ContextState);
    if (Uint32 BindSRBMask = m_BindInfo.GetCommitMask())
    {
        BindProgramResources(BindSRBMask);
    }

#    ifdef DILIGENT_DEVELOPMENT
    // Must be called after BindProgramResources as it needs BaseBindings
    DvpValidateCommittedShaderResources();
#    endif

    BufferGLImpl* pBufferGL = ClassPtrCast<BufferGLImpl>(Attribs.pAttribsBuffer);
    pBufferGL->BufferMemoryBarrier(
        MEMORY_BARRIER_INDIRECT_BUFFER, // Command data sourced from buffer objects by
                                        // Draw*Indirect and DispatchComputeIndirect commands after the barrier
                                        // will reflect data written by shaders prior to the barrier.The buffer
                                        // objects affected by this bit are derived from the DRAW_INDIRECT_BUFFER
                                        // and DISPATCH_INDIRECT_BUFFER bindings.
        m_ContextState);

    constexpr bool ResetVAO = false; // GL_DISPATCH_INDIRECT_BUFFER does not affect VAO
    m_ContextState.BindBuffer(GL_DISPATCH_INDIRECT_BUFFER, pBufferGL->m_GlBuffer, ResetVAO);
    DEV_CHECK_GL_ERROR("Failed to bind a buffer for dispatch indirect command");

    glDispatchComputeIndirect(StaticCast<GLintptr>(Attribs.DispatchArgsByteOffset));
    DEV_CHECK_GL_ERROR("glDispatchComputeIndirect() failed");

    m_ContextState.BindBuffer(GL_DISPATCH_INDIRECT_BUFFER, GLObjectWrappers::GLBufferObj::Null(), ResetVAO);

    PostDraw();
#else
    UNSUPPORTED("Compute shaders are not supported");
#endif
}